

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order6j
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A1,sunrealtype **A2,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  ulong uVar2;
  double dVar3;
  
  b_00 = (sunrealtype *)calloc((long)s,8);
  b_01 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_mv(A3,c2,s,b_00);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A2,b_00,s,b_01), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_mv(A1,b_01,s,b_00), iVar1 == 0)) &&
     (((0 < s && (c1 != (sunrealtype *)0x0)) &&
      ((b_00 != (sunrealtype *)0x0 && (b_01 != (sunrealtype *)0x0)))))) {
    uVar2 = 0;
    do {
      b_01[uVar2] = c1[uVar2] * b_00[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)s != uVar2);
    if (b != (sunrealtype *)0x0) {
      dVar3 = 0.0;
      uVar2 = 0;
      do {
        dVar3 = dVar3 + b[uVar2] * b_01[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)s != uVar2);
      free(b_00);
      free(b_01);
      return (uint)(ABS(dVar3 + -0.006944444444444444) <= 1.4901161193847656e-08);
    }
  }
  else {
    free(b_00);
    free(b_01);
  }
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6j(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A1, sunrealtype** A2,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bcAAAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bcAAAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bcAAAc - SUN_RCONST(1.0) / SUN_RCONST(144.0)) > TOL) ? SUNFALSE
                                                                       : SUNTRUE;
}